

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Maybe<kj::Own<kj::_::Event>_> __thiscall kj::_::ExclusiveJoinPromiseNode::Branch::fire(Branch *this)

{
  Event *extraout_RDX;
  long in_RSI;
  NullableValue<kj::Exception> *this_00;
  Maybe<kj::Own<kj::_::Event>_> MVar1;
  Runnable local_2e8 [2];
  NullableValue<kj::Exception> local_2d8;
  NullableValue<kj::Exception> local_178;
  
  if (*(long *)(in_RSI + 0x28) + 8 == in_RSI) {
    local_2e8[0]._vptr_Runnable = (_func_int **)&PTR_run_0042f158;
    this_00 = &local_178;
  }
  else {
    local_2e8[0]._vptr_Runnable = (_func_int **)&PTR_run_0042f188;
    this_00 = &local_2d8;
  }
  runCatchingExceptions((Maybe<kj::Exception> *)this_00,local_2e8);
  NullableValue<kj::Exception>::~NullableValue(this_00);
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(*(long *)(in_RSI + 0x28) + 0x88));
  (this->super_Event)._vptr_Event = (_func_int **)0x0;
  (this->super_Event).loop = (EventLoop *)0x0;
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<Event>> ExclusiveJoinPromiseNode::Branch::fire() {
  // Cancel the branch that didn't return first.  Ignore exceptions caused by cancellation.
  if (this == &joinNode.left) {
    kj::runCatchingExceptions([&]() { joinNode.right.dependency = nullptr; });
  } else {
    kj::runCatchingExceptions([&]() { joinNode.left.dependency = nullptr; });
  }

  joinNode.onReadyEvent.arm();
  return nullptr;
}